

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall
ObjectTest_basic_value_constructor_vector_Test::~ObjectTest_basic_value_constructor_vector_Test
          (ObjectTest_basic_value_constructor_vector_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_value_constructor_vector) {
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::vector<bool>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::vector<signed char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::vector<unsigned char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::vector<short>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::vector<int>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::vector<long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::vector<long long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::vector<intmax_t>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::vector<float>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::vector<double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::vector<long double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::vector<std::u8string>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::vector<object>);
}